

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void once_init(void)

{
  AsyncLogging *this;
  element_type *this_00;
  string local_38;
  shared_ptr<AsyncLogging> local_18;
  
  this = (AsyncLogging *)operator_new(0x1e8);
  Logger::getLogFileName_abi_cxx11_();
  AsyncLogging::AsyncLogging(this,&local_38,2);
  std::shared_ptr<AsyncLogging>::shared_ptr<AsyncLogging,void>(&local_18,this);
  std::shared_ptr<AsyncLogging>::operator=(&AsyncLogger_,&local_18);
  std::shared_ptr<AsyncLogging>::~shared_ptr(&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = std::__shared_ptr_access<AsyncLogging,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<AsyncLogging,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&AsyncLogger_);
  AsyncLogging::start(this_00);
  return;
}

Assistant:

void once_init() {
    AsyncLogger_ = std::shared_ptr<AsyncLogging>(new AsyncLogging(Logger::getLogFileName()));
    AsyncLogger_->start();
}